

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_string_float_limit(char *string,int prec)

{
  char *c;
  int dot;
  int prec_local;
  char *string_local;
  
  dot = 0;
  c = string;
LAB_0015895b:
  do {
    if (*c == '\0') {
LAB_001589c5:
      return (int)c - (int)string;
    }
    if (*c == '.') {
      dot = 1;
      c = c + 1;
      goto LAB_0015895b;
    }
    if (dot == prec + 1) {
      *c = '\0';
      goto LAB_001589c5;
    }
    if (0 < dot) {
      dot = dot + 1;
    }
    c = c + 1;
  } while( true );
}

Assistant:

NK_LIB int
nk_string_float_limit(char *string, int prec)
{
int dot = 0;
char *c = string;
while (*c) {
if (*c == '.') {
dot = 1;
c++;
continue;
}
if (dot == (prec+1)) {
*c = 0;
break;
}
if (dot > 0) dot++;
c++;
}
return (int)(c - string);
}